

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_formatter.cpp
# Opt level: O0

string * __thiscall
bidfx_public_api::price::subject::SubjectFormatter::NumericCharacterEntity::EncodeString
          (string *__return_storage_ptr__,NumericCharacterEntity *this,string *s)

{
  ulong uVar1;
  char *pcVar2;
  mapped_type *pmVar3;
  bool bVar4;
  string local_88;
  undefined1 local_68 [8];
  string encoded;
  ulong uStack_40;
  char c;
  size_t i;
  allocator<char> local_21;
  string *local_20;
  string *s_local;
  NumericCharacterEntity *this_local;
  
  local_20 = s;
  s_local = (string *)this;
  this_local = (NumericCharacterEntity *)__return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    for (uStack_40 = 0; uVar1 = std::__cxx11::string::length(), uStack_40 < uVar1;
        uStack_40 = uStack_40 + 1) {
      pcVar2 = (char *)std::__cxx11::string::at((ulong)s);
      encoded.field_2._M_local_buf[0xf] = *pcVar2;
      if (encoded.field_2._M_local_buf[0xf] < 0xff) {
        pmVar3 = std::
                 map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->encodings_table_,encoded.field_2._M_local_buf + 0xf);
        std::__cxx11::string::string((string *)local_68,(string *)pmVar3);
      }
      else {
        CharacterEntity_abi_cxx11_((string *)local_68,this,encoded.field_2._M_local_buf[0xf]);
      }
      uVar1 = std::__cxx11::string::empty();
      bVar4 = (uVar1 & 1) == 0;
      if (bVar4) {
        std::__cxx11::string::string((string *)&local_88,(string *)s);
        EncodeRemaining(__return_storage_ptr__,this,&local_88,uStack_40,(string *)local_68);
        std::__cxx11::string::~string((string *)&local_88);
      }
      std::__cxx11::string::~string((string *)local_68);
      if (bVar4) {
        return __return_storage_ptr__;
      }
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SubjectFormatter::NumericCharacterEntity::EncodeString(std::string s)
{
    if (s.empty())
    {
        return "";
    }

    for (size_t i = 0; i < s.length(); i++)
    {
        char c = s.at(i);
        std::string encoded = c < 255 ? encodings_table_[c] : CharacterEntity(c);
        if (!encoded.empty())
        {
            return EncodeRemaining(s, i, encoded);
        }
    }

    return s;
}